

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall deqp::gls::ContextArrayPack::~ContextArrayPack(ContextArrayPack *this)

{
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<deqp::gls::ContextArray_**,_std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>_>
  local_20;
  __normal_iterator<deqp::gls::ContextArray_**,_std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>_>
  local_18;
  iterator itr;
  ContextArrayPack *this_local;
  
  this->_vptr_ContextArrayPack = (_func_int **)&PTR__ContextArrayPack_032d6b08;
  itr._M_current = (ContextArray **)this;
  local_18._M_current =
       (ContextArray **)
       std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::begin
                 (&this->m_arrays);
  while( true ) {
    local_20._M_current =
         (ContextArray **)
         std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::end
                   (&this->m_arrays);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<deqp::gls::ContextArray_**,_std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>_>
              ::operator*(&local_18);
    if (*ppCVar2 != (ContextArray *)0x0) {
      (*((*ppCVar2)->super_Array)._vptr_Array[1])();
    }
    __gnu_cxx::
    __normal_iterator<deqp::gls::ContextArray_**,_std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>_>
    ::operator++(&local_18,0);
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  tcu::Surface::~Surface(&this->m_screen);
  std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::~vector
            (&this->m_arrays);
  return;
}

Assistant:

ContextArrayPack::~ContextArrayPack (void)
{
	for (std::vector<ContextArray*>::iterator itr = m_arrays.begin(); itr != m_arrays.end(); itr++)
		delete *itr;

	delete m_program;
}